

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

int anon_unknown.dwarf_2b::compareColors(void *arg1,void *arg2)

{
  void *arg2_local;
  void *arg1_local;
  
  if (*(char *)((long)arg1 + 7) == *(char *)((long)arg2 + 7)) {
    if (*arg1 == *arg2) {
      if (*(char *)((long)arg1 + 4) == *(char *)((long)arg2 + 4)) {
        if (*(char *)((long)arg1 + 5) == *(char *)((long)arg2 + 5)) {
          arg1_local._4_4_ = (uint)*(byte *)((long)arg1 + 6) - (uint)*(byte *)((long)arg2 + 6);
        }
        else {
          arg1_local._4_4_ = (uint)*(byte *)((long)arg1 + 5) - (uint)*(byte *)((long)arg2 + 5);
        }
      }
      else {
        arg1_local._4_4_ = (uint)*(byte *)((long)arg1 + 4) - (uint)*(byte *)((long)arg2 + 4);
      }
    }
    else {
      arg1_local._4_4_ = *arg2 - *arg1;
    }
  }
  else {
    arg1_local._4_4_ = (uint)*(byte *)((long)arg1 + 7) - (uint)*(byte *)((long)arg2 + 7);
  }
  return arg1_local._4_4_;
}

Assistant:

int compareColors(const void *arg1, const void *arg2)
  {
    if ( ((COLORS*)arg1)->a != ((COLORS*)arg2)->a )
      return (int)(((COLORS*)arg1)->a) - (int)(((COLORS*)arg2)->a);

    if ( ((COLORS*)arg1)->num != ((COLORS*)arg2)->num )
      return (int)(((COLORS*)arg2)->num) - (int)(((COLORS*)arg1)->num);

    if ( ((COLORS*)arg1)->r != ((COLORS*)arg2)->r )
      return (int)(((COLORS*)arg1)->r) - (int)(((COLORS*)arg2)->r);

    if ( ((COLORS*)arg1)->g != ((COLORS*)arg2)->g )
      return (int)(((COLORS*)arg1)->g) - (int)(((COLORS*)arg2)->g);

    return (int)(((COLORS*)arg1)->b) - (int)(((COLORS*)arg2)->b);
  }